

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_subgraph.cc
# Opt level: O0

SplitDomains * __thiscall
anon_unknown.dwarf_54df9::CommonSubgraphRunner::branch_assigning
          (CommonSubgraphRunner *this,SplitDomains *d,int left,int right)

{
  bool bVar1;
  int in_ECX;
  undefined8 in_RDX;
  key_type *in_RSI;
  SplitDomains *in_RDI;
  int in_R8D;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar2;
  type *s;
  type *_;
  iterator __end3_2;
  iterator __begin3_2;
  map<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
  *__range3_2;
  int *v_1;
  iterator __end3_1;
  iterator __begin3_1;
  type *__range3_1;
  int *v;
  iterator __end3;
  iterator __begin3;
  type *__range3;
  anon_class_8_1_22bd0074 partition_of;
  string no_label;
  map<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
  new_partitions;
  type *r;
  type *l;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *__range2;
  SplitDomains *result;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffffe20;
  mapped_type *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffffe38;
  mapped_type *in_stack_fffffffffffffe40;
  type *in_stack_fffffffffffffe60;
  type *in_stack_fffffffffffffe68;
  _Self local_188;
  _Self local_180;
  undefined1 *local_178;
  _Base_ptr local_170;
  undefined1 local_168;
  reference local_138;
  _Self local_130;
  _Self local_128;
  type *local_120;
  _Base_ptr local_118;
  undefined1 local_110;
  reference local_d0;
  _Self local_c8;
  _Self local_c0;
  type *local_b8;
  undefined1 *local_b0;
  undefined1 local_a8 [32];
  undefined1 local_88 [48];
  type *local_58;
  type *local_50;
  reference local_48;
  pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>
  *local_40;
  __normal_iterator<const_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_*,_std::vector<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
  local_38;
  undefined8 local_30;
  undefined1 local_21;
  int local_20;
  int local_1c;
  undefined8 local_18;
  
  local_21 = 0;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  SplitDomains::SplitDomains((SplitDomains *)0x12b245);
  local_30 = local_18;
  local_38._M_current =
       (pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>
        *)std::
          vector<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::begin((vector<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
  local_40 = (pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>
              *)std::
                vector<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                ::end((vector<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_*,_std::vector<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                           ((__normal_iterator<const_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_*,_std::vector<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                             *)in_stack_fffffffffffffe20._M_node,
                            (__normal_iterator<const_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_*,_std::vector<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    local_48 = __gnu_cxx::
               __normal_iterator<const_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_*,_std::vector<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
               ::operator*(&local_38);
    local_50 = std::
               get<0ul,std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>
                         ((pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>
                           *)0x12b2c1);
    local_58 = std::
               get<1ul,std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>
                         ((pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>
                           *)0x12b2d6);
    std::
    map<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
    ::map((map<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
           *)0x12b2eb);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
    local_b0 = local_a8;
    local_b8 = local_50;
    local_c0._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    local_c8._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    while (bVar1 = std::operator==(&local_c0,&local_c8), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_d0 = std::_Rb_tree_const_iterator<int>::operator*
                           ((_Rb_tree_const_iterator<int> *)0x12b36f);
      if (local_1c != *local_d0) {
        branch_assigning::anon_class_8_1_22bd0074::operator()
                  ((anon_class_8_1_22bd0074 *)in_stack_fffffffffffffe68,
                   (InputGraph *)in_stack_fffffffffffffe60,(int)((ulong)in_RSI >> 0x20),(int)in_RSI)
        ;
        in_stack_fffffffffffffe40 =
             std::
             map<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
             ::operator[]((map<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                           *)in_stack_fffffffffffffe60,in_RSI);
        pVar2 = std::set<int,std::less<int>,std::allocator<int>>::emplace<int_const&>
                          (&in_stack_fffffffffffffe40->first,
                           (int *)in_stack_fffffffffffffe38._M_node);
        in_stack_fffffffffffffe38 = pVar2.first._M_node;
        in_stack_fffffffffffffe37 = pVar2.second;
        local_118 = in_stack_fffffffffffffe38._M_node;
        local_110 = in_stack_fffffffffffffe37;
      }
      std::_Rb_tree_const_iterator<int>::operator++
                ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffe20._M_node);
    }
    local_120 = local_58;
    local_128._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    local_130._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    while (bVar1 = std::operator==(&local_128,&local_130), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_138 = std::_Rb_tree_const_iterator<int>::operator*
                            ((_Rb_tree_const_iterator<int> *)0x12b4ca);
      if (local_20 != *local_138) {
        branch_assigning::anon_class_8_1_22bd0074::operator()
                  ((anon_class_8_1_22bd0074 *)in_stack_fffffffffffffe68,
                   (InputGraph *)in_stack_fffffffffffffe60,(int)((ulong)in_RSI >> 0x20),(int)in_RSI)
        ;
        in_stack_fffffffffffffe28 =
             std::
             map<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
             ::operator[]((map<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                           *)in_stack_fffffffffffffe60,in_RSI);
        pVar2 = std::set<int,std::less<int>,std::allocator<int>>::emplace<int_const&>
                          (&in_stack_fffffffffffffe40->first,
                           (int *)in_stack_fffffffffffffe38._M_node);
        in_stack_fffffffffffffe20 = pVar2.first._M_node;
        in_stack_fffffffffffffe1f = pVar2.second;
        local_170 = in_stack_fffffffffffffe20._M_node;
        local_168 = in_stack_fffffffffffffe1f;
      }
      std::_Rb_tree_const_iterator<int>::operator++
                ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffe20._M_node);
    }
    local_178 = local_88;
    local_180._M_node =
         (_Base_ptr)
         std::
         map<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
         ::begin((map<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    local_188._M_node =
         (_Base_ptr)
         std::
         map<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
         ::end((map<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    while (bVar1 = std::operator==(&local_180,&local_188), ((bVar1 ^ 0xffU) & 1) != 0) {
      std::
      _Rb_tree_iterator<std::pair<const_std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
      ::operator*((_Rb_tree_iterator<std::pair<const_std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                   *)0x12b5cd);
      in_stack_fffffffffffffe68 =
           std::
           get<0ul,std::tuple<bool,bool,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>const,std::pair<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>>
                     ((pair<const_std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                       *)0x12b5dc);
      in_stack_fffffffffffffe60 =
           std::
           get<1ul,std::tuple<bool,bool,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>const,std::pair<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>>
                     ((pair<const_std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                       *)0x12b5eb);
      bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)0x12b5fa);
      if ((!bVar1) &&
         (bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x12b60c), !bVar1)) {
        std::
        vector<std::pair<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::pair<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>>>
        ::
        emplace_back<std::set<int,std::less<int>,std::allocator<int>>&,std::set<int,std::less<int>,std::allocator<int>>&>
                  ((vector<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                   &in_stack_fffffffffffffe28->first,
                   (set<int,_std::less<int>,_std::allocator<int>_> *)
                   in_stack_fffffffffffffe20._M_node);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                    *)in_stack_fffffffffffffe20._M_node);
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe20._M_node);
    std::
    map<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
    ::~map((map<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::less<std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<bool,_bool,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
            *)0x12b655);
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_*,_std::vector<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
    ::operator++(&local_38);
  }
  return in_RDI;
}

Assistant:

auto branch_assigning(const SplitDomains & d, int left, int right) -> SplitDomains
        {
            SplitDomains result;

            for (auto & [l, r] : d.partitions) {
                map<tuple<bool, bool, string_view, string_view>, pair<set<int>, set<int>>> new_partitions;

                string no_label;
                auto partition_of = [&](const InputGraph & g, int w, int v) -> tuple<bool, bool, string_view, string_view> {
                    return tuple{
                        g.adjacent(w, v),
                        g.adjacent(v, w),
                        g.adjacent(w, v) ? g.edge_label(w, v) : no_label,
                        g.adjacent(v, w) ? g.edge_label(v, w) : no_label};
                };

                for (auto & v : l)
                    if (left != v)
                        new_partitions[partition_of(first, left, v)].first.emplace(v);

                for (auto & v : r)
                    if (right != v)
                        new_partitions[partition_of(second, right, v)].second.emplace(v);

                for (auto & [_, s] : new_partitions)
                    if ((! s.first.empty()) && (! s.second.empty()))
                        result.partitions.emplace_back(s.first, s.second);
            }

            return result;
        }